

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O2

object_type * __thiscall
entt::basic_registry<entt::entity>::pool_handler<Swarm>::assign<Swarm_const&>
          (pool_handler<Swarm> *this,basic_registry<entt::entity> *registry,entity entt,Swarm *args)

{
  object_type *args_2;
  
  args_2 = basic_storage<entt::entity,Swarm,void>::construct<Swarm_const&>
                     ((basic_storage<entt::entity,Swarm,void> *)this,entt,args);
  sigh<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Swarm_&)>::publish
            (&this->construction,entt,registry,args_2);
  return args_2;
}

Assistant:

decltype(auto) assign(basic_registry &registry, const Entity entt, Args &&... args) {
            if constexpr(std::is_empty_v<Component>) {
                storage<Entity, Component>::construct(entt);
                construction.publish(entt, registry, Component{});
                return Component{std::forward<Args>(args)...};
            } else {
                auto &component = storage<Entity, Component>::construct(entt, std::forward<Args>(args)...);
                construction.publish(entt, registry, component);
                return component;
            }
        }